

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(Int64ToDoubleMap *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64ToDoubleMap_0033e7b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  ::MapFieldLite(&this->map_);
  if (this != (Int64ToDoubleMap *)&_Int64ToDoubleMap_default_instance_) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

Int64ToDoubleMap::Int64ToDoubleMap()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Int64ToDoubleMap)
}